

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_lib.cc
# Opt level: O3

char * SSL_get_psk_identity(SSL *s)

{
  SSL_SESSION *pSVar1;
  char *pcVar2;
  
  if (s != (SSL *)0x0) {
    pSVar1 = SSL_get_session(s);
    if (pSVar1 == (SSL_SESSION *)0x0) {
      pcVar2 = (char *)0x0;
    }
    else {
      pcVar2 = *(char **)pSVar1->krb5_client_princ;
    }
    return pcVar2;
  }
  return (char *)0x0;
}

Assistant:

const char *SSL_get_psk_identity(const SSL *ssl) {
  if (ssl == NULL) {
    return NULL;
  }
  SSL_SESSION *session = SSL_get_session(ssl);
  if (session == NULL) {
    return NULL;
  }
  return session->psk_identity.get();
}